

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FpgaIO.cpp
# Opt level: O3

nodeaddr_t __thiscall FpgaIO::GetPromAddress(FpgaIO *this,PromType type,bool isWrite)

{
  nodeaddr_t nVar1;
  ostream *poVar2;
  bool bVar3;
  
  nVar1 = 8;
  if (type != PROM_M25P16 || !isWrite) {
    bVar3 = !isWrite;
    nVar1 = 9;
    if ((((type != PROM_M25P16 || !bVar3) && (nVar1 = 0x3000, type != PROM_25AA128 || bVar3)) &&
        (nVar1 = 0x3002, type != PROM_25AA128 || !bVar3)) &&
       (((nVar1 = 0x3010, type != PROM_25AA128_1 || bVar3 &&
         (nVar1 = 0x3012, type != PROM_25AA128_1 || !bVar3)) &&
        ((nVar1 = 0x3020, type != PROM_25AA128_2 || bVar3 &&
         (nVar1 = 0x3022, type != PROM_25AA128_2 || !bVar3)))))) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"FpgaIO::GetPromAddress: unsupported PROM type ",0x2e);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,type);
      std::endl<char,std::char_traits<char>>(poVar2);
      nVar1 = 0;
    }
  }
  return nVar1;
}

Assistant:

nodeaddr_t FpgaIO::GetPromAddress(PromType type, bool isWrite)
{
    if (type == PROM_M25P16 && isWrite)
        return 0x0008;
    else if (type == PROM_M25P16 && !isWrite)
        return 0x0009;
    else if (type == PROM_25AA128 && isWrite)
        return 0x3000;
    else if (type == PROM_25AA128 && !isWrite)
        return 0x3002;
    else if (type == PROM_25AA128_1 && isWrite)
        return 0x3010;
    else if (type == PROM_25AA128_1 && !isWrite)
        return 0x3012;
    else if (type == PROM_25AA128_2 && isWrite)
        return 0x3020;
    else if (type == PROM_25AA128_2 && !isWrite)
        return 0x3022;
    else
        std::cerr << "FpgaIO::GetPromAddress: unsupported PROM type " << type << std::endl;

    return 0x00;
}